

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

void nni_pipe_start(nni_pipe *p)

{
  _Bool _Var1;
  nng_log_level nVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  char *msg;
  char *msgid;
  nni_sock *pnVar7;
  nni_dialer *pnVar8;
  nni_listener *pnVar9;
  nni_stat_item *item;
  char local_b8 [8];
  char addr [144];
  
  pnVar9 = p->p_listener;
  if (pnVar9 == (nni_listener *)0x0) {
LAB_0011d131:
    pnVar8 = p->p_dialer;
    if (pnVar8 == (nni_dialer *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x603,"p->p_listener != NULL || p->p_dialer != NULL");
      pnVar9 = p->p_listener;
      if (pnVar9 != (nni_listener *)0x0) goto LAB_0011d24b;
      pnVar8 = p->p_dialer;
      if (pnVar8 == (nni_dialer *)0x0) {
        return;
      }
    }
    pnVar7 = pnVar8->d_sock;
    nni_mtx_lock(&pnVar7->s_mx);
    pnVar8->d_pipe = p;
    pnVar8->d_currtime = pnVar8->d_inirtime;
    nni_mtx_unlock(&pnVar7->s_mx);
    nni_stat_inc(&pnVar7->st_pipes,1);
    nni_stat_inc(&pnVar8->st_pipes,1);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
    _Var1 = nni_pipe_is_closed(p);
    if (_Var1) {
      nni_stat_inc(&pnVar8->st_reject,1);
      nni_stat_inc(&pnVar7->st_rejects,1);
      nVar2 = nng_log_get_level();
      if (NNG_LOG_INFO < nVar2) {
        uVar3 = nni_pipe_sock_id(p);
        pcVar6 = nni_pipe_peer_addr(p,local_b8);
        nng_log_debug("NNG-PIPEREJECT","Pipe on socket<%u> from %s rejected by callback",
                      (ulong)uVar3,pcVar6);
      }
      goto LAB_0011d421;
    }
    iVar4 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar4 != 0) {
      item = &pnVar8->st_reject;
      goto LAB_0011d2e1;
    }
    nni_stat_set_id(&p->st_root,p->p_id);
    nni_stat_set_id(&p->st_id,p->p_id);
    nni_stat_register(&p->st_root);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
    nVar2 = nng_log_get_level();
    if (nVar2 < NNG_LOG_DEBUG) goto LAB_0011d421;
    uVar5 = nni_pipe_id(p);
    uVar3 = pnVar7->s_id;
    pcVar6 = nni_pipe_peer_addr(p,local_b8);
    msgid = "NNG-CONNECT";
    msg = "Connected pipe<%u> on socket<%u> to %s";
  }
  else {
    if (p->p_dialer != (nni_dialer *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x602,"p->p_listener == NULL || p->p_dialer == NULL");
      pnVar9 = p->p_listener;
      if (pnVar9 == (nni_listener *)0x0) goto LAB_0011d131;
    }
LAB_0011d24b:
    pnVar7 = pnVar9->l_sock;
    nni_stat_inc(&pnVar9->st_pipes,1);
    nni_stat_inc(&pnVar7->st_pipes,1);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
    _Var1 = nni_pipe_is_closed(p);
    if (_Var1) {
      nni_stat_inc(&pnVar9->st_reject,1);
      nni_stat_inc(&pnVar7->st_rejects,1);
      goto LAB_0011d306;
    }
    iVar4 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar4 != 0) {
      item = &pnVar9->st_reject;
LAB_0011d2e1:
      nni_stat_inc(item,1);
      nni_stat_inc(&pnVar7->st_rejects,1);
      nni_pipe_close(p);
LAB_0011d306:
      nni_pipe_rele(p);
      return;
    }
    nni_stat_set_id(&p->st_root,p->p_id);
    nni_stat_set_id(&p->st_id,p->p_id);
    nni_stat_register(&p->st_root);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
    nVar2 = nng_log_get_level();
    if (nVar2 < NNG_LOG_DEBUG) goto LAB_0011d421;
    uVar5 = nni_pipe_id(p);
    uVar3 = pnVar7->s_id;
    pcVar6 = nni_pipe_peer_addr(p,local_b8);
    msgid = "NNG-ACCEPT";
    msg = "Accepted pipe<%u> on socket<%u> from %s";
  }
  nng_log_debug(msgid,msg,(ulong)uVar5,(ulong)uVar3,pcVar6);
LAB_0011d421:
  nni_pipe_rele(p);
  return;
}

Assistant:

void
nni_pipe_start(nni_pipe *p)
{
	// exactly one of these must be set.
	NNI_ASSERT(p->p_listener == NULL || p->p_dialer == NULL);
	NNI_ASSERT(p->p_listener != NULL || p->p_dialer != NULL);

	// NB: starting the pipe can actually cause the pipe
	// to be deallocated before this returns (if it is rejected)
	if (p->p_listener) {
		listener_start_pipe(p->p_listener, p);
	} else if (p->p_dialer) {
		dialer_start_pipe(p->p_dialer, p);
	}
}